

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.hpp
# Opt level: O1

long duckdb::SubtractOperatorOverflowCheck::Operation<long,long,long>(long left,long right)

{
  bool bVar1;
  OutOfRangeException *this;
  long result;
  long local_b0;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = duckdb::TrySubtractOperator::Operation<long,long,long>(left,right,&local_b0);
  if (bVar1) {
    return local_b0;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Overflow in subtraction of %s (%s - %s)!","");
  duckdb::TypeIdToString_abi_cxx11_((PhysicalType)&local_48);
  NumericHelper::ToString<long>(&local_68,left);
  NumericHelper::ToString<long>(&local_88,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_a8,&local_48,&local_68,&local_88);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TrySubtractOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in subtraction of %s (%s - %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}